

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryReactionTaskFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this;
  RecyclableObject *pRVar6;
  JavascriptPromiseReactionTaskFunction *this_00;
  JavascriptPromiseReaction *this_01;
  Var pvVar7;
  JavascriptPromiseCapability *this_02;
  RecyclableObject *this_03;
  JavascriptPromise *this_04;
  JavascriptMethod p_Var8;
  Var pvVar9;
  JavascriptException *err;
  CallInfo local_dc [2];
  undefined1 local_c8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  AutoCatchHandlerExists autoCatchHandlerExists;
  JavascriptPromise *promise;
  Var promiseVar;
  bool isPromiseRejectionHandled;
  JavascriptExceptionObject *exception;
  Var handlerResult;
  RecyclableObject *handler;
  JavascriptPromiseCapability *promiseCapability;
  Var argument;
  JavascriptPromiseReaction *reaction;
  JavascriptPromiseReactionTaskFunction *reactionTaskFunction;
  Var undefinedVar;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x4d6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x4d7,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetLibrary(pSVar3);
  pRVar6 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  this_00 = VarTo<Js::JavascriptPromiseReactionTaskFunction,Js::RecyclableObject>(function);
  this_01 = JavascriptPromiseReactionTaskFunction::GetReaction(this_00);
  pvVar7 = JavascriptPromiseReactionTaskFunction::GetArgument(this_00);
  this_02 = JavascriptPromiseReaction::GetCapabilities(this_01);
  this_03 = JavascriptPromiseReaction::GetHandler(this_01);
  promiseVar._7_1_ = true;
  bVar2 = ScriptContext::IsScriptContextInDebugMode(pSVar3);
  if (bVar2) {
    pvVar9 = JavascriptPromiseCapability::GetPromise(this_02);
    bVar2 = VarIs<Js::JavascriptPromise>(pvVar9);
    if (bVar2) {
      this_04 = VarTo<Js::JavascriptPromise>(pvVar9);
      bVar2 = WillRejectionBeUnhandled(this_04);
      promiseVar._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    }
  }
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled,pSVar3,
             promiseVar._7_1_);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_c8,pTVar4);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar4);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  ThreadContext::AssertJsReentrancy(pTVar4);
  p_Var8 = RecyclableObject::GetEntryPoint(this_03);
  CheckIsExecutable(this_03,p_Var8);
  p_Var8 = RecyclableObject::GetEntryPoint(this_03);
  CallInfo::CallInfo(local_dc,CallFlags_Value,2);
  CallInfo::CallInfo((CallInfo *)((long)&err + 4),CallFlags_Value,2);
  pvVar7 = (*p_Var8)(this_03,(CallInfo)this_03,local_dc[0],0,0,0,0,stack0xffffffffffffff1c,pRVar6,
                     pvVar7);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_c8);
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x50b,"(handlerResult != nullptr)","handlerResult != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvVar9 = JavascriptPromiseCapability::GetResolve(this_02);
  pvVar7 = TryCallResolveOrRejectHandler(pvVar9,pvVar7,pSVar3);
  return pvVar7;
}

Assistant:

Var JavascriptPromise::EntryReactionTaskFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        JavascriptPromiseReactionTaskFunction* reactionTaskFunction = VarTo<JavascriptPromiseReactionTaskFunction>(function);
        JavascriptPromiseReaction* reaction = reactionTaskFunction->GetReaction();
        Var argument = reactionTaskFunction->GetArgument();
        JavascriptPromiseCapability* promiseCapability = reaction->GetCapabilities();
        RecyclableObject* handler = reaction->GetHandler();
        Var handlerResult = nullptr;
        JavascriptExceptionObject* exception = nullptr;

        {

            bool isPromiseRejectionHandled = true;
            if (scriptContext->IsScriptContextInDebugMode())
            {
                // only necessary to determine if false if debugger is attached.  This way we'll
                // correctly break on exceptions raised in promises that result in uhandled rejection
                // notifications
                Var promiseVar = promiseCapability->GetPromise();
                if (VarIs<JavascriptPromise>(promiseVar))
                {
                    JavascriptPromise* promise = VarTo<JavascriptPromise>(promiseVar);
                    isPromiseRejectionHandled = !promise->WillRejectionBeUnhandled();
                }
            }

            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext, isPromiseRejectionHandled);
            try
            {
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    handlerResult = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                        handler, Js::CallInfo(Js::CallFlags::CallFlags_Value, 2),
                                        undefinedVar,
                                        argument);
                }
                END_SAFE_REENTRANT_CALL
            }
            catch (const JavascriptException& err)
            {
                exception = err.GetAndClear();
            }
        }

        if (exception != nullptr)
        {
            return TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        Assert(handlerResult != nullptr);

        return TryCallResolveOrRejectHandler(promiseCapability->GetResolve(), handlerResult, scriptContext);
    }